

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group.cxx
# Opt level: O0

void __thiscall Fl_Group::insert(Fl_Group *this,Fl_Widget *o,int index)

{
  Fl_Widget *pFVar1;
  uint uVar2;
  Fl_Group *pFVar3;
  Fl_Widget **ppFVar4;
  int local_3c;
  int j;
  Fl_Widget *t;
  int n;
  Fl_Group *g;
  int index_local;
  Fl_Widget *o_local;
  Fl_Group *this_local;
  
  pFVar3 = Fl_Widget::parent(o);
  g._4_4_ = index;
  if (pFVar3 != (Fl_Group *)0x0) {
    pFVar3 = Fl_Widget::parent(o);
    uVar2 = find(pFVar3,o);
    if (pFVar3 == this) {
      if ((int)uVar2 < index) {
        g._4_4_ = index - 1;
      }
      if (g._4_4_ == uVar2) {
        return;
      }
    }
    remove(pFVar3,(char *)(ulong)uVar2);
  }
  o->parent_ = this;
  if (this->children_ == 0) {
    this->array_ = (Fl_Widget **)o;
  }
  else if (this->children_ == 1) {
    pFVar1 = (Fl_Widget *)this->array_;
    ppFVar4 = (Fl_Widget **)malloc(0x10);
    this->array_ = ppFVar4;
    if (g._4_4_ == 0) {
      *this->array_ = o;
      this->array_[1] = pFVar1;
    }
    else {
      *this->array_ = pFVar1;
      this->array_[1] = o;
    }
  }
  else {
    if ((this->children_ & this->children_ - 1U) == 0) {
      ppFVar4 = (Fl_Widget **)realloc(this->array_,(long)(this->children_ << 1) << 3);
      this->array_ = ppFVar4;
    }
    for (local_3c = this->children_; (int)g._4_4_ < local_3c; local_3c = local_3c + -1) {
      this->array_[local_3c] = this->array_[local_3c + -1];
    }
    this->array_[local_3c] = o;
  }
  this->children_ = this->children_ + 1;
  init_sizes(this);
  return;
}

Assistant:

void Fl_Group::insert(Fl_Widget &o, int index) {
  if (o.parent()) {
    Fl_Group* g = o.parent();
    int n = g->find(o);
    if (g == this) {
      if (index > n) index--;
      if (index == n) return;
    }
    g->remove(n);
  }
  o.parent_ = this;
  if (children_ == 0) { // use array pointer to point at single child
    array_ = (Fl_Widget**)&o;
  } else if (children_ == 1) { // go from 1 to 2 children
    Fl_Widget* t = (Fl_Widget*)array_;
    array_ = (Fl_Widget**)malloc(2*sizeof(Fl_Widget*));
    if (index) {array_[0] = t; array_[1] = &o;}
    else {array_[0] = &o; array_[1] = t;}
  } else {
    if (!(children_ & (children_-1))) // double number of children
      array_ = (Fl_Widget**)realloc((void*)array_,
				    2*children_*sizeof(Fl_Widget*));
    int j; for (j = children_; j > index; j--) array_[j] = array_[j-1];
    array_[j] = &o;
  }
  children_++;
  init_sizes();
}